

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O2

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::QuadratizeOrLinearize
          (EExpr *__return_storage_ptr__,
          ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,EExpr *el,EExpr *er)

{
  double dVar1;
  size_ty sVar2;
  size_ty sVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  AffineExpr local_360;
  LinTerms local_2e0;
  LinTerms local_268;
  AlgebraicExpression<mp::QuadAndLinTerms> local_1f0;
  
  if ((*(size_ty *)
        ((long)&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
        + 0x10) != 0) &&
     (*(size_ty *)
       ((long)&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
               super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
               m_data.
               super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
       + 0x10) != 0 ||
      *(size_ty *)
       ((long)&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long> + 0x10) != 0)) {
    Convert2AffineExpr(&local_360,this,el);
    LinTerms::LinTerms(&local_268,&local_360.super_LinTerms);
    EExpr::EExpr((EExpr *)&local_1f0,&local_268);
    AlgebraicExpression<mp::QuadAndLinTerms>::operator=(&el->super_QuadraticExpr,&local_1f0);
    QuadAndLinTerms::~QuadAndLinTerms(&local_1f0.super_QuadAndLinTerms);
    LinTerms::~LinTerms(&local_268);
    LinTerms::~LinTerms(&local_360.super_LinTerms);
  }
  if ((*(size_ty *)
        ((long)&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
        + 0x10) != 0) &&
     (*(size_ty *)
       ((long)&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
               super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
               m_data.
               super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
       + 0x10) != 0 ||
      *(size_ty *)
       ((long)&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long> + 0x10) != 0)) {
    Convert2AffineExpr(&local_360,this,er);
    LinTerms::LinTerms(&local_2e0,&local_360.super_LinTerms);
    EExpr::EExpr((EExpr *)&local_1f0,&local_2e0);
    AlgebraicExpression<mp::QuadAndLinTerms>::operator=(&er->super_QuadraticExpr,&local_1f0);
    QuadAndLinTerms::~QuadAndLinTerms(&local_1f0.super_QuadAndLinTerms);
    LinTerms::~LinTerms(&local_2e0);
    LinTerms::~LinTerms(&local_360.super_LinTerms);
  }
  if (((this->ifFltCon_ != 0) ||
      ((this->flat_cvt_).
       super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
       .
       super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
       .options_.passQuadObj_ == 0)) &&
     (sVar2 = *(size_ty *)
               ((long)&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
                       super_small_vector_base<std::allocator<double>,_6U>.m_data.
                       super_small_vector_data_base<double_*,_unsigned_long> + 0x10),
     *(size_ty *)
      ((long)&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
              super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
              m_data.
              super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
      + 0x10) != 0 || sVar2 != 0)) {
    sVar3 = *(size_ty *)
             ((long)&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
                     super_small_vector_base<std::allocator<double>,_6U>.m_data.
                     super_small_vector_data_base<double_*,_unsigned_long> + 0x10);
    if ((sVar2 == sVar3) &&
       (*(size_ty *)
         ((long)&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
                 super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                 .m_data.
                 super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
         + 0x10) != 0 || sVar3 != 0)) {
      if ((((sVar2 == 1) &&
           ((dVar1 = (er->super_QuadraticExpr).constant_term_, dVar1 == 0.0 && (!NAN(dVar1))))) &&
          (dVar1 = (el->super_QuadraticExpr).constant_term_, dVar1 == 0.0)) &&
         ((!NAN(dVar1) &&
          (*(el->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr ==
           *(er->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr)))) {
        Convert2Pow2(__return_storage_ptr__,this,(LinTerms *)el,(LinTerms *)er);
        return __return_storage_ptr__;
      }
      QuadAndLinTerms::sort_terms((QuadAndLinTerms *)el);
      QuadAndLinTerms::sort_terms((QuadAndLinTerms *)er);
      bVar4 = AlgebraicExpression<mp::QuadAndLinTerms>::operator==
                        (&el->super_QuadraticExpr,&er->super_QuadraticExpr);
      if (bVar4) {
        Convert2Pow2(__return_storage_ptr__,this,el);
        return __return_storage_ptr__;
      }
    }
  }
  sVar2 = *(size_ty *)
           ((long)&(er->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
                   super_small_vector_base<std::allocator<double>,_6U>.m_data.
                   super_small_vector_data_base<double_*,_unsigned_long> + 0x10);
  if (((sVar2 == 0) ||
      (sVar3 = *(size_ty *)
                ((long)&(el->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long> + 0x10), sVar3 == 0))
     || ((this->ifFltCon_ == 0 &&
         (((this->flat_cvt_).
           super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           .
           super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           .options_.passQuadObj_ != 0 &&
          (auVar5._8_4_ = (int)(sVar3 >> 0x20), auVar5._0_8_ = sVar3, auVar5._12_4_ = 0x45300000,
          auVar6._8_4_ = (int)(sVar2 >> 0x20), auVar6._0_8_ = sVar2, auVar6._12_4_ = 0x45300000,
          ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) *
          ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) <=
          (this->flat_cvt_).
          super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          .
          super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          .options_.QPMultOutCard_)))))) {
    MultiplyOut(__return_storage_ptr__,el,er);
  }
  else {
    DontMultOut(__return_storage_ptr__,this,el,er);
  }
  return __return_storage_ptr__;
}

Assistant:

EExpr QuadratizeOrLinearize(EExpr& el, EExpr& er) {
    if (!el.is_affine() && !er.is_constant())
      el = Convert2AffineExpr(std::move(el));      // will convert to a new var now
    if (!er.is_affine() && !el.is_constant())
      er = Convert2AffineExpr(std::move(er));
    if (!IfQuadratizePow2() &&
        !er.is_constant() && !el.is_constant() &&
        er.GetLinTerms().size() == el.GetLinTerms().size()) {
      const auto& ellt = el.GetLinTerms();
      const auto& erlt = er.GetLinTerms();
      if (1 == erlt.size() &&    // same variable in el and er
          0.0 == er.constant_term() && 0.0 == el.constant_term() &&
          ellt.var(0) == erlt.var(0)) {
        return Convert2Pow2(ellt, erlt);
      }
      el.sort_terms();
      er.sort_terms();
      if  (el == er) {            // Convert expr*expr to expr^2
        return Convert2Pow2(std::move(el));
      }
    }  // Otherwise, we proceed to store proper multiplication,
    // unless the result is affine
    if (er.GetLinTerms().size() && el.GetLinTerms().size()  // both linear
        && (!IfMultOutQPTerms()
            || !IfMultOutQPTerms(el.GetLinTerms(), er.GetLinTerms()))) {
      // Create a separate QC with this product.
      // This is handy if we are walking the objective,
      // as MIPFlatCvt only linearizes QC.
      return DontMultOut(std::move(el), std::move(er));
    }
    return MultiplyOut(el, er);   // Quadratize
  }